

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

void __thiscall ftxui::Frame::SetBox(Frame *this,Box box)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  
  uVar7 = box._8_8_;
  uVar8 = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  uVar5 = uVar8 >> 0x20;
  if ((this->super_Node).field_0x5c == '\x01') {
    iVar6 = box.x_min;
    uVar4 = box.x_max - iVar6;
    uVar1 = (this->super_Node).requirement_.min_x;
    iVar2 = (this->super_Node).requirement_.selected_box.x_min;
    if ((int)uVar1 <= (int)uVar4) {
      uVar1 = uVar4;
    }
    iVar9 = ((this->super_Node).requirement_.selected_box.x_max - iVar2) / 2 +
            (iVar2 - (int)uVar4 / 2);
    iVar2 = ~uVar4 + uVar1;
    if (iVar9 < (int)(~uVar4 + uVar1)) {
      iVar2 = iVar9;
    }
    iVar9 = 0;
    if (0 < iVar2) {
      iVar9 = iVar2;
    }
    uVar8 = (ulong)(uint)(iVar6 - iVar9);
    uVar5 = (ulong)((uVar1 + iVar6) - iVar9);
  }
  if ((this->super_Node).field_0x5d == '\x01') {
    iVar6 = box.y_min;
    uVar4 = box.y_max - iVar6;
    uVar1 = (this->super_Node).requirement_.min_y;
    iVar2 = (this->super_Node).requirement_.selected_box.y_min;
    if ((int)uVar1 <= (int)uVar4) {
      uVar1 = uVar4;
    }
    iVar9 = ((this->super_Node).requirement_.selected_box.y_max - iVar2) / 2 +
            (iVar2 - (int)uVar4 / 2);
    iVar2 = ~uVar4 + uVar1;
    if (iVar9 < (int)(~uVar4 + uVar1)) {
      iVar2 = iVar9;
    }
    iVar9 = 0;
    if (0 < iVar2) {
      iVar9 = iVar2;
    }
    uVar7 = CONCAT44((uVar1 + iVar6) - iVar9,iVar6 - iVar9);
  }
  peVar3 = (((this->super_Node).children_.
             super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (**(code **)((long)peVar3->_vptr_Node + 0x18))(peVar3,uVar8 & 0xffffffff | uVar5 << 0x20,uVar7);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);
    auto& selected_box = requirement_.selected_box;
    Box children_box = box;

    if (x_frame_) {
      int external_dimx = box.x_max - box.x_min;
      int internal_dimx = std::max(requirement_.min_x, external_dimx);
      int focused_dimx = selected_box.x_max - selected_box.x_min;
      int dx = selected_box.x_min - external_dimx / 2 + focused_dimx / 2;
      dx = std::max(0, std::min(internal_dimx - external_dimx - 1, dx));
      children_box.x_min = box.x_min - dx;
      children_box.x_max = box.x_min + internal_dimx - dx;
    }

    if (y_frame_) {
      int external_dimy = box.y_max - box.y_min;
      int internal_dimy = std::max(requirement_.min_y, external_dimy);
      int focused_dimy = selected_box.y_max - selected_box.y_min;
      int dy = selected_box.y_min - external_dimy / 2 + focused_dimy / 2;
      dy = std::max(0, std::min(internal_dimy - external_dimy - 1, dy));
      children_box.y_min = box.y_min - dy;
      children_box.y_max = box.y_min + internal_dimy - dy;
    }

    children_[0]->SetBox(children_box);
  }